

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushID(int int_id)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  uint *puVar4;
  ImGuiContext *ctx;
  uint *__dest;
  long lVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  byte local_24 [4];
  
  pIVar3 = GImGui->CurrentWindow;
  __dest = (pIVar3->IDStack).Data;
  iVar2 = (pIVar3->IDStack).Size;
  lVar5 = (long)iVar2;
  uVar8 = ~__dest[lVar5 + -1];
  lVar7 = 0;
  do {
    uVar8 = uVar8 >> 8 ^ GCrc32LookupTable[(uint)local_24[lVar7] ^ uVar8 & 0xff];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  if (iVar2 == (pIVar3->IDStack).Capacity) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    iVar9 = iVar2 + 1;
    if (iVar2 + 1 < iVar6) {
      iVar9 = iVar6;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
    puVar4 = (pIVar3->IDStack).Data;
    if (puVar4 != (uint *)0x0) {
      memcpy(__dest,puVar4,(long)(pIVar3->IDStack).Size << 2);
      puVar4 = (pIVar3->IDStack).Data;
      if ((puVar4 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar4,GImAllocatorUserData);
    }
    (pIVar3->IDStack).Data = __dest;
    (pIVar3->IDStack).Capacity = iVar9;
    lVar5 = (long)(pIVar3->IDStack).Size;
  }
  __dest[lVar5] = ~uVar8;
  (pIVar3->IDStack).Size = (pIVar3->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushID(int int_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetIDNoKeepAlive(int_id);
    window->IDStack.push_back(id);
}